

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextRankExtractor.hpp
# Opt level: O2

void __thiscall
cppjieba::TextRankExtractor::TextRankExtractor
          (TextRankExtractor *this,string *dictPath,string *hmmFilePath,string *stopWordPath,
          string *userDict)

{
  MixSegment::MixSegment(&this->segment_,dictPath,hmmFilePath,userDict);
  (this->stopWords_)._M_h._M_buckets = &(this->stopWords_)._M_h._M_single_bucket;
  (this->stopWords_)._M_h._M_bucket_count = 1;
  (this->stopWords_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->stopWords_)._M_h._M_element_count = 0;
  (this->stopWords_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->stopWords_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->stopWords_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  LoadStopWordDict(this,stopWordPath);
  return;
}

Assistant:

TextRankExtractor(const string& dictPath, 
        const string& hmmFilePath, 
        const string& stopWordPath, 
        const string& userDict = "") 
    : segment_(dictPath, hmmFilePath, userDict) {
    LoadStopWordDict(stopWordPath);
  }